

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall chrono::utils::Generator::normalizeMixture(Generator *this)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  long lVar5;
  int i;
  pointer psVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  psVar4 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 == psVar6) {
    AddMixtureIngredient((Generator *)&stack0xfffffffffffffff0,(MixtureType)this,1.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff8);
  }
  else {
    dVar9 = 0.0;
    lVar5 = (long)psVar6 - (long)psVar4 >> 4;
    psVar6 = psVar4;
    lVar7 = lVar5;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      p_Var3 = &psVar6->
                super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>;
      psVar6 = psVar6 + 1;
      dVar9 = dVar9 + p_Var3->_M_ptr->m_ratio;
    }
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      peVar1 = (psVar4->
               super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      peVar1->m_ratio = peVar1->m_ratio / dVar9;
      if (lVar7 == 0) {
        dVar10 = 0.0;
      }
      else {
        peVar2 = psVar4[-1].
                 super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar10 = peVar2->m_cumRatio + peVar2->m_ratio;
      }
      peVar1->m_cumRatio = dVar10;
      psVar4 = psVar4 + 1;
    }
  }
  return;
}

Assistant:

void Generator::normalizeMixture() {
    if (m_mixture.empty()) {
        AddMixtureIngredient(MixtureType::SPHERE, 1);
        return;
    }

    double sum = 0;

    for (int i = 0; i < m_mixture.size(); i++)
        sum += m_mixture[i]->m_ratio;

    for (int i = 0; i < m_mixture.size(); i++) {
        m_mixture[i]->m_ratio /= sum;
        if (i == 0)
            m_mixture[i]->m_cumRatio = 0;
        else
            m_mixture[i]->m_cumRatio = m_mixture[i - 1]->m_cumRatio + m_mixture[i - 1]->m_ratio;
    }
}